

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int balloc(bstring b,int olen)

{
  uint uVar1;
  uint uVar2;
  uchar *__ptr;
  uchar *__dest;
  uint uVar3;
  int iVar4;
  
  iVar4 = -1;
  if ((b != (bstring)0x0) && (__ptr = b->data, __ptr != (uchar *)0x0)) {
    uVar1 = b->slen;
    if ((-1 < (long)(int)uVar1) &&
       ((uVar2 = b->mlen, 0 < (int)uVar2 && (0 < olen && uVar1 <= uVar2)))) {
      if (uVar2 <= (uint)olen) {
        uVar3 = 8;
        if ((7 < (uint)olen) &&
           (uVar3 = (uint)olen >> 1 | olen, uVar3 = uVar3 >> 2 | uVar3, uVar3 = uVar3 >> 4 | uVar3,
           uVar3 = uVar3 >> 8 | uVar3, uVar3 = (uVar3 >> 0x10 | uVar3) + 1, (int)uVar3 <= olen)) {
          uVar3 = olen;
        }
        if (uVar2 < uVar3) {
          if ((SBORROW4(uVar2 * 7,uVar1 * 8) == (int)(uVar2 * 7 + uVar1 * -8) < 0) &&
             (__dest = (uchar *)malloc((ulong)(uVar3 + 1)), __dest != (uchar *)0x0)) {
            if (uVar1 != 0) {
              memcpy(__dest,__ptr,(long)(int)uVar1);
            }
            free(__ptr);
          }
          else {
            __dest = (uchar *)realloc(__ptr,(ulong)(uVar3 + 1));
            if ((__dest == (uchar *)0x0) &&
               (__dest = (uchar *)realloc(b->data,(ulong)(olen + 1)), uVar3 = olen,
               __dest == (uchar *)0x0)) {
              return -1;
            }
          }
          b->data = __dest;
          b->mlen = uVar3;
          __dest[b->slen] = '\0';
        }
      }
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int balloc (bstring b, int olen) {
	int len;
	if (b == NULL || b->data == NULL || b->slen < 0 || b->mlen <= 0 ||
	    b->mlen < b->slen || olen <= 0) {
		return BSTR_ERR;
	}

	if (olen >= b->mlen) {
		unsigned char * x;

		if ((len = snapUpSize (olen)) <= b->mlen) return BSTR_OK;

		/* Assume probability of a non-moving realloc is 0.125 */
		if (7 * b->mlen < 8 * b->slen) {

			/* If slen is close to mlen in size then use realloc to reduce
			   the memory defragmentation */

			reallocStrategy:;

			x = (unsigned char *) bstr__realloc (b->data, (size_t) len + 1);
			if (x == NULL) {

				/* Since we failed, try allocating the tighest possible
				   allocation */

				len = olen;
				x = (unsigned char *) bstr__realloc (b->data, (size_t) len + 1);
				if (NULL == x) {
					return BSTR_ERR;
				}
			}
		} else {

			/* If slen is not close to mlen then avoid the penalty of copying
			   the extra bytes that are allocated, but not considered part of
			   the string */

			if (NULL == (x = (unsigned char *) bstr__alloc ((size_t) len + 1))) {

				/* Perhaps there is no available memory for the two
				   allocations to be in memory at once */

				goto reallocStrategy;

			} else {
				if (b->slen) bstr__memcpy ((char *) x, (char *) b->data,
				                           (size_t) b->slen);
				bstr__free (b->data);
			}
		}
		b->data = x;
		b->mlen = len;
		b->data[b->slen] = (unsigned char) '\0';

#if defined (BSTRLIB_TEST_CANARY)
		if (len > b->slen + 1) {
			memchr (b->data + b->slen + 1, 'X', len - (b->slen + 1));
		}
#endif
	}

	return BSTR_OK;
}